

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

int If_CutMergeOrdered_(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  
  uVar4 = *(uint *)&pC0->field_0x1c;
  uVar11 = uVar4 >> 0x18;
  uVar10 = *(uint *)&pC1->field_0x1c;
  uVar8 = uVar10 >> 0x18;
  uVar3 = uVar4 >> 0x10 & 0xff;
  if ((uVar11 == uVar3) && (uVar8 == uVar3)) {
    if (0xffffff < uVar4) {
      uVar2 = 0;
      do {
        if ((&pC0[1].Area)[uVar2] != (&pC1[1].Area)[uVar2]) {
          return 0;
        }
        iVar1 = (int)uVar2;
        p->pPerm[2][uVar2] = iVar1;
        p->pPerm[1][uVar2] = iVar1;
        p->pPerm[0][uVar2] = iVar1;
        (&pC[1].Area)[uVar2] = (&pC0[1].Area)[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar11 != uVar2);
    }
    cVar7 = (char)(uVar10 >> 0x18);
    pC->field_0x1f = cVar7;
    pC->uSign = pC1->uSign | pC0->uSign;
    p->uSharedMask = 0xffffffff >> (-cVar7 & 0x1fU);
    iVar1 = 1;
  }
  else {
    p->uSharedMask = 0;
    uVar14 = 0;
    uVar9 = 0;
    if (uVar4 < 0x1000000) {
LAB_008bacd4:
      iVar1 = 0;
      if ((int)(uVar9 + uVar8) <= (int)(uVar3 + uVar14)) {
        if ((int)uVar14 < (int)uVar8) {
          lVar12 = (long)(int)uVar14;
          lVar6 = 0;
          do {
            p->pPerm[1][lVar12 + lVar6] = uVar9 + (int)lVar6;
            (&pC[1].Area)[(int)uVar9 + lVar6] = (&pC1[1].Area)[lVar12 + lVar6];
            lVar6 = lVar6 + 1;
          } while ((ulong)uVar8 - lVar12 != lVar6);
          uVar9 = uVar9 + (int)lVar6;
        }
        pC->field_0x1f = (char)uVar9;
        pC->uSign = pC1->uSign | pC0->uSign;
        iVar1 = 1;
        if ((int)uVar9 < 1) {
          __assert_fail("c > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                        ,0x113,
                        "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)");
        }
      }
    }
    else {
      iVar1 = 0;
      uVar9 = 0;
      uVar4 = 0;
      if (uVar10 < 0x1000000) {
LAB_008bad81:
        if ((int)(uVar9 + uVar11) <= (int)(uVar3 + uVar4)) {
          if ((int)uVar4 < (int)uVar11) {
            lVar6 = (long)(int)uVar4;
            lVar12 = 0;
            do {
              p->pPerm[0][lVar6 + lVar12] = uVar9 + (int)lVar12;
              (&pC[1].Area)[(int)uVar9 + lVar12] = (&pC0[1].Area)[lVar6 + lVar12];
              lVar12 = lVar12 + 1;
            } while ((ulong)uVar11 - lVar6 != lVar12);
            uVar9 = uVar9 + (int)lVar12;
          }
          pC->field_0x1f = (char)uVar9;
          pC->uSign = pC1->uSign | pC0->uSign;
          iVar1 = 1;
          if ((int)uVar9 < 1) {
            __assert_fail("c > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                          ,0x107,
                          "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)")
            ;
          }
        }
      }
      else {
        if (uVar3 != 0) {
          iVar13 = 0;
          uVar14 = 0;
          uVar4 = 0;
          uVar10 = uVar9;
          do {
            if ((int)(&pC0[1].Area)[(int)uVar4] < (int)(&pC1[1].Area)[(int)uVar14]) {
              p->pPerm[0][(int)uVar4] = uVar10;
              uVar5 = uVar4 + 1;
              uVar9 = uVar10 + 1;
              (&pC[1].Area)[(int)uVar10] = (&pC0[1].Area)[(int)uVar4];
              uVar4 = uVar5;
              if (uVar5 == uVar11) goto LAB_008bacd4;
            }
            else if ((int)(&pC1[1].Area)[(int)uVar14] < (int)(&pC0[1].Area)[(int)uVar4]) {
              p->pPerm[1][(int)uVar14] = uVar10;
              uVar5 = uVar14 + 1;
              uVar9 = uVar10 + 1;
              (&pC[1].Area)[(int)uVar10] = (&pC1[1].Area)[(int)uVar14];
              uVar14 = uVar5;
              if (uVar5 == uVar8) goto LAB_008bad81;
            }
            else {
              p->uSharedMask = p->uSharedMask | 1 << ((byte)uVar10 & 0x1f);
              p->pPerm[2][iVar13] = uVar10;
              p->pPerm[1][(int)uVar14] = uVar10;
              p->pPerm[0][(int)uVar4] = uVar10;
              uVar5 = uVar4 + 1;
              uVar9 = uVar10 + 1;
              (&pC[1].Area)[(int)uVar10] = (&pC0[1].Area)[(int)uVar4];
              uVar14 = uVar14 + 1;
              if (uVar5 == uVar11) goto LAB_008bacd4;
              uVar4 = uVar5;
              if (uVar14 == uVar8) goto LAB_008bad81;
              iVar13 = iVar13 + 1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar3);
        }
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int If_CutMergeOrdered_( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            p->pPerm[0][i] = p->pPerm[1][i] = p->pPerm[2][i] = i;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        p->uSharedMask = Abc_InfoMask( nLimit );
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0;
    p->uSharedMask = 0;
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            p->pPerm[0][i] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            p->pPerm[1][k] = c;
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            p->uSharedMask |= (1 << c);
            p->pPerm[0][i] = p->pPerm[1][k] = p->pPerm[2][s++] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
    {
        p->pPerm[0][i] = c;
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
    {
        p->pPerm[1][k] = c;
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;
}